

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O2

int __thiscall FParser::FindOperatorBackwards(FParser *this,int start,int stop,char *value)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  lVar5 = (long)stop;
  iVar3 = 0;
  do {
    if (lVar5 < start) {
      return -1;
    }
    if (this->TokenType[lVar5] == operator_) {
      cVar1 = *this->Tokens[lVar5];
      uVar4 = (uint)(cVar1 == ')');
      if (cVar1 == '(') {
        uVar4 = 0xffffffff;
      }
      iVar3 = iVar3 + uVar4;
      if (iVar3 == 0) {
        iVar2 = strcmp(value,this->Tokens[lVar5]);
        iVar3 = 0;
        if (iVar2 == 0) {
          return (int)lVar5;
        }
      }
    }
    lVar5 = lVar5 + -1;
  } while( true );
}

Assistant:

int FParser::FindOperatorBackwards(int start, int stop, const char *value)
{
	int i;
	int bracketlevel = 0;
	
	for(i=stop; i>=start; i--)      // check backwards
    {
		// operators only
		
		if(TokenType[i] != operator_) continue;
		
		// use bracketlevel to check the number of brackets
		// which we are inside
		
		bracketlevel += Tokens[i][0]=='(' ? -1 :
		Tokens[i][0]==')' ? 1 : 0;
		
		// only check when we are not in brackets
		// if we find what we want, return it
		
		if(!bracketlevel && !strcmp(value, Tokens[i]))
			return i;
    }
	
	return -1;
}